

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

int32_t __thiscall spvtools::opt::analysis::Constant::GetS32(Constant *this)

{
  uint __line;
  int iVar1;
  int32_t iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *__assertion;
  
  iVar1 = (*this->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assertion = "type()->AsInteger() != nullptr";
    __line = 0x52;
  }
  else {
    iVar1 = (*this->type_->_vptr_Type[10])();
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24) == 0x20) {
      iVar1 = (*this->_vptr_Constant[0xe])(this);
      if ((IntConstant *)CONCAT44(extraout_var_01,iVar1) != (IntConstant *)0x0) {
        iVar2 = IntConstant::GetS32BitValue((IntConstant *)CONCAT44(extraout_var_01,iVar1));
        return iVar2;
      }
      iVar1 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_02,iVar1) != 0) {
        return 0;
      }
      __assertion = "AsNullConstant() && \"Must be an integer constant.\"";
      __line = 0x58;
    }
    else {
      __assertion = "type()->AsInteger()->width() == 32";
      __line = 0x53;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,__line,"int32_t spvtools::opt::analysis::Constant::GetS32() const");
}

Assistant:

int32_t Constant::GetS32() const {
  assert(type()->AsInteger() != nullptr);
  assert(type()->AsInteger()->width() == 32);

  if (const IntConstant* ic = AsIntConstant()) {
    return ic->GetS32BitValue();
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
    return 0;
  }
}